

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  Arena *this_01;
  void *pvVar3;
  FieldDescriptorProto *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_fffffffffffffe38;
  FieldDescriptorProto *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  ArenaStringPtr *in_stack_fffffffffffffe50;
  Arena *in_stack_fffffffffffffe88;
  FieldOptions *in_stack_fffffffffffffe90;
  FieldDescriptorProto *this_02;
  
  Message::Message(&in_stack_fffffffffffffe40->super_Message);
  *in_RDI = &PTR__FieldDescriptorProto_008d8740;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  *(uint32 *)(in_RDI + 2) = (in_RSI->_has_bits_).has_bits_[0];
  internal::CachedSize::CachedSize((CachedSize *)0x4f86e4);
  this_00 = &in_RSI->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_fffffffffffffe40,
               (UnknownFieldSet *)in_stack_fffffffffffffe38);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 3),psVar2);
  bVar1 = _internal_has_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_name_abi_cxx11_((FieldDescriptorProto *)0x4f88a5);
    GetArenaNoVirtual(in_stack_fffffffffffffe40);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffe50,
               (string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 4),psVar2);
  bVar1 = _internal_has_extendee(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x4f89ae);
    GetArenaNoVirtual(in_stack_fffffffffffffe40);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffe50,
               (string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 5),psVar2);
  bVar1 = _internal_has_type_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x4f8a85);
    GetArenaNoVirtual(in_stack_fffffffffffffe40);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffe50,
               (string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  this_02 = (FieldDescriptorProto *)(in_RDI + 6);
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)this_02,psVar2);
  bVar1 = _internal_has_default_value(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    in_stack_fffffffffffffe90 =
         (FieldOptions *)_internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x4f8b4a);
    in_stack_fffffffffffffe88 = GetArenaNoVirtual(in_stack_fffffffffffffe40);
    internal::ArenaStringPtr::Set
              (in_stack_fffffffffffffe50,
               (string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)(in_RDI + 7),psVar2);
  bVar1 = _internal_has_json_name(in_RSI);
  if (bVar1) {
    internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x4f8bf7);
    this_01 = GetArenaNoVirtual(in_stack_fffffffffffffe40);
    internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)this_01,
               (string *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               (string *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  }
  bVar1 = _internal_has_options(this_02);
  if (bVar1) {
    pvVar3 = operator_new(0x58);
    FieldOptions::FieldOptions(in_stack_fffffffffffffe90,(FieldOptions *)in_stack_fffffffffffffe88);
    in_RDI[8] = pvVar3;
  }
  else {
    in_RDI[8] = 0;
  }
  memcpy(in_RDI + 9,&in_RSI->number_,0x10);
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto(const FieldDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  extendee_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_extendee()) {
    extendee_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_extendee(),
      GetArenaNoVirtual());
  }
  type_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_type_name()) {
    type_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_type_name(),
      GetArenaNoVirtual());
  }
  default_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_default_value()) {
    default_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_default_value(),
      GetArenaNoVirtual());
  }
  json_name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_json_name()) {
    json_name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_json_name(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::FieldOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  ::memcpy(&number_, &from.number_,
    static_cast<size_t>(reinterpret_cast<char*>(&type_) -
    reinterpret_cast<char*>(&number_)) + sizeof(type_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FieldDescriptorProto)
}